

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *out,int64_t v)

{
  char b [8];
  
  b = (char  [8])v;
  std::ostream::write((char *)out,(long)b);
  return;
}

Assistant:

void
write (T& out, int64_t v)
{
    signed char b[8];

    b[0] = (signed char) (v);
    b[1] = (signed char) (v >> 8);
    b[2] = (signed char) (v >> 16);
    b[3] = (signed char) (v >> 24);
    b[4] = (signed char) (v >> 32);
    b[5] = (signed char) (v >> 40);
    b[6] = (signed char) (v >> 48);
    b[7] = (signed char) (v >> 56);

    writeSignedChars<S> (out, b, 8);
}